

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Internal.h
# Opt level: O0

int __thiscall
chatra::IdPool<chatra::Requester,_chatra::Thread>::remove
          (IdPool<chatra::Requester,_chatra::Thread> *this,char *__filename)

{
  int extraout_EAX;
  lock_guard<chatra::SpinLock> local_28;
  lock_guard<chatra::SpinLock> lock0;
  KeyBaseType idBaseType;
  Requester id_local;
  IdPool<chatra::Requester,_chatra::Thread> *this_local;
  
  lock0._M_device = (mutex_type *)__filename;
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_28,&this->lockValues);
  std::
  unordered_map<unsigned_long,_chatra::Thread_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_chatra::Thread_*>_>_>
  ::erase(&this->values,(key_type *)&lock0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->recycledIds,(value_type_conflict2 *)&lock0);
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_28);
  return extraout_EAX;
}

Assistant:

void remove(KeyType id) {
		auto idBaseType = static_cast<KeyBaseType>(id);
		std::lock_guard<SpinLock> lock0(lockValues);
		values.erase(idBaseType);
		recycledIds.push_back(idBaseType);
	}